

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

xmlChar * htmlGetMetaEncoding(htmlDocPtr doc)

{
  xmlChar *str1;
  int iVar1;
  bool bVar2;
  xmlChar *value;
  long lStack_38;
  int http;
  xmlAttrPtr attr;
  xmlChar *encoding;
  xmlChar *content;
  htmlNodePtr cur;
  htmlDocPtr doc_local;
  
  if (doc != (htmlDocPtr)0x0) {
    for (content = (xmlChar *)doc->children; content != (xmlChar *)0x0;
        content = *(xmlChar **)(content + 0x30)) {
      if ((*(int *)(content + 8) == 1) && (*(long *)(content + 0x10) != 0)) {
        iVar1 = xmlStrEqual(*(xmlChar **)(content + 0x10),"html");
        if (iVar1 != 0) break;
        iVar1 = xmlStrEqual(*(xmlChar **)(content + 0x10),"head");
        if (iVar1 != 0) goto LAB_0019adca;
        iVar1 = xmlStrEqual(*(xmlChar **)(content + 0x10),(xmlChar *)"meta");
        if (iVar1 != 0) goto LAB_0019add8;
      }
    }
    if (content != (xmlChar *)0x0) {
      for (content = *(xmlChar **)(content + 0x18); content != (xmlChar *)0x0;
          content = *(xmlChar **)(content + 0x30)) {
        if ((*(int *)(content + 8) == 1) && (*(long *)(content + 0x10) != 0)) {
          iVar1 = xmlStrEqual(*(xmlChar **)(content + 0x10),"head");
          if (iVar1 != 0) break;
          iVar1 = xmlStrEqual(*(xmlChar **)(content + 0x10),(xmlChar *)"meta");
          if (iVar1 != 0) goto LAB_0019add8;
        }
      }
      if (content != (xmlChar *)0x0) {
LAB_0019adca:
        content = *(xmlChar **)(content + 0x18);
LAB_0019add8:
        for (; content != (xmlChar *)0x0; content = *(xmlChar **)(content + 0x30)) {
          if (((*(int *)(content + 8) == 1) && (*(long *)(content + 0x10) != 0)) &&
             (iVar1 = xmlStrEqual(*(xmlChar **)(content + 0x10),(xmlChar *)"meta"), iVar1 != 0)) {
            lStack_38 = *(long *)(content + 0x58);
            encoding = (xmlChar *)0x0;
            bVar2 = false;
            for (; lStack_38 != 0; lStack_38 = *(long *)(lStack_38 + 0x30)) {
              if (((*(long *)(lStack_38 + 0x18) != 0) &&
                  (*(int *)(*(long *)(lStack_38 + 0x18) + 8) == 3)) &&
                 (*(long *)(*(long *)(lStack_38 + 0x18) + 0x30) == 0)) {
                str1 = *(xmlChar **)(*(long *)(lStack_38 + 0x18) + 0x50);
                iVar1 = xmlStrcasecmp(*(xmlChar **)(lStack_38 + 0x10),(xmlChar *)"http-equiv");
                if ((iVar1 == 0) &&
                   (iVar1 = xmlStrcasecmp(str1,(xmlChar *)"Content-Type"), iVar1 == 0)) {
                  bVar2 = true;
                }
                else if ((str1 != (xmlChar *)0x0) &&
                        (iVar1 = xmlStrcasecmp(*(xmlChar **)(lStack_38 + 0x10),"content"),
                        iVar1 == 0)) {
                  encoding = str1;
                }
                if ((bVar2) && (encoding != (xmlChar *)0x0)) {
                  attr = (xmlAttrPtr)xmlStrstr(encoding,"charset=");
                  if (attr == (xmlAttrPtr)0x0) {
                    attr = (xmlAttrPtr)xmlStrstr(encoding,(xmlChar *)"Charset=");
                  }
                  if (attr == (xmlAttrPtr)0x0) {
                    attr = (xmlAttrPtr)xmlStrstr(encoding,(xmlChar *)"CHARSET=");
                  }
                  if (attr == (xmlAttrPtr)0x0) {
                    attr = (xmlAttrPtr)xmlStrstr(encoding,(xmlChar *)"charset =");
                    if (attr == (xmlAttrPtr)0x0) {
                      attr = (xmlAttrPtr)xmlStrstr(encoding,(xmlChar *)"Charset =");
                    }
                    if (attr == (xmlAttrPtr)0x0) {
                      attr = (xmlAttrPtr)xmlStrstr(encoding,(xmlChar *)"CHARSET =");
                    }
                    if (attr != (xmlAttrPtr)0x0) {
                      attr = (xmlAttrPtr)((long)&attr->type + 1);
                    }
                  }
                  else {
                    attr = (xmlAttrPtr)&attr->type;
                  }
                  if (attr != (xmlAttrPtr)0x0) {
                    while( true ) {
                      bVar2 = true;
                      if (*(char *)&attr->_private != ' ') {
                        bVar2 = *(char *)&attr->_private == '\t';
                      }
                      if (!bVar2) break;
                      attr = (xmlAttrPtr)((long)&attr->_private + 1);
                    }
                  }
                  return (xmlChar *)attr;
                }
              }
            }
          }
        }
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
htmlGetMetaEncoding(htmlDocPtr doc) {
    htmlNodePtr cur;
    const xmlChar *content;
    const xmlChar *encoding;

    if (doc == NULL)
	return(NULL);
    cur = doc->children;

    /*
     * Search the html
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrEqual(cur->name, BAD_CAST"html"))
		break;
	    if (xmlStrEqual(cur->name, BAD_CAST"head"))
		goto found_head;
	    if (xmlStrEqual(cur->name, BAD_CAST"meta"))
		goto found_meta;
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(NULL);
    cur = cur->children;

    /*
     * Search the head
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrEqual(cur->name, BAD_CAST"head"))
		break;
	    if (xmlStrEqual(cur->name, BAD_CAST"meta"))
		goto found_meta;
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(NULL);
found_head:
    cur = cur->children;

    /*
     * Search the meta elements
     */
found_meta:
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrEqual(cur->name, BAD_CAST"meta")) {
		xmlAttrPtr attr = cur->properties;
		int http;
		const xmlChar *value;

		content = NULL;
		http = 0;
		while (attr != NULL) {
		    if ((attr->children != NULL) &&
		        (attr->children->type == XML_TEXT_NODE) &&
		        (attr->children->next == NULL)) {
			value = attr->children->content;
			if ((!xmlStrcasecmp(attr->name, BAD_CAST"http-equiv"))
			 && (!xmlStrcasecmp(value, BAD_CAST"Content-Type")))
			    http = 1;
			else if ((value != NULL)
			 && (!xmlStrcasecmp(attr->name, BAD_CAST"content")))
			    content = value;
			if ((http != 0) && (content != NULL))
			    goto found_content;
		    }
		    attr = attr->next;
		}
	    }
	}
	cur = cur->next;
    }
    return(NULL);

found_content:
    encoding = xmlStrstr(content, BAD_CAST"charset=");
    if (encoding == NULL)
	encoding = xmlStrstr(content, BAD_CAST"Charset=");
    if (encoding == NULL)
	encoding = xmlStrstr(content, BAD_CAST"CHARSET=");
    if (encoding != NULL) {
	encoding += 8;
    } else {
	encoding = xmlStrstr(content, BAD_CAST"charset =");
	if (encoding == NULL)
	    encoding = xmlStrstr(content, BAD_CAST"Charset =");
	if (encoding == NULL)
	    encoding = xmlStrstr(content, BAD_CAST"CHARSET =");
	if (encoding != NULL)
	    encoding += 9;
    }
    if (encoding != NULL) {
	while ((*encoding == ' ') || (*encoding == '\t')) encoding++;
    }
    return(encoding);
}